

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

void __thiscall
particleSamples::read_in_particle_samples_mixed_event_and_filter(particleSamples *this)

{
  if (this->read_mixed_events == false) {
    this->full_particle_list_mixed_event = this->full_particle_list;
    this->particle_list_mixed_event = this->particle_list;
  }
  else {
    read_in_particle_samples_mixed_event(this);
    filter_particles(this,this->particle_monval,this->full_particle_list_mixed_event,
                     this->particle_list_mixed_event);
  }
  if (this->analyze_BF == true) {
    filter_particles(this,this->particle_monval_a,this->full_particle_list_mixed_event,
                     this->balance_function_particle_a_mixed_event);
    filter_particles(this,this->particle_monval_abar,this->full_particle_list_mixed_event,
                     this->balance_function_particle_abar_mixed_event);
    filter_particles(this,this->particle_monval_b,this->full_particle_list_mixed_event,
                     this->balance_function_particle_b_mixed_event);
    filter_particles(this,this->particle_monval_bbar,this->full_particle_list_mixed_event,
                     this->balance_function_particle_bbar_mixed_event);
    return;
  }
  return;
}

Assistant:

void particleSamples::read_in_particle_samples_mixed_event_and_filter() {
    if (!read_mixed_events) {
        full_particle_list_mixed_event = full_particle_list;
        particle_list_mixed_event = particle_list;
    } else {
        read_in_particle_samples_mixed_event();

        filter_particles(
            particle_monval, full_particle_list_mixed_event,
            particle_list_mixed_event);
    }
    if (analyze_BF) {
        filter_particles(
            particle_monval_a, full_particle_list_mixed_event,
            balance_function_particle_a_mixed_event);
        filter_particles(
            particle_monval_abar, full_particle_list_mixed_event,
            balance_function_particle_abar_mixed_event);
        filter_particles(
            particle_monval_b, full_particle_list_mixed_event,
            balance_function_particle_b_mixed_event);
        filter_particles(
            particle_monval_bbar, full_particle_list_mixed_event,
            balance_function_particle_bbar_mixed_event);
    }
}